

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_suite.cpp
# Opt level: O0

void expand_suite::run(void)

{
  expand_empty();
  expand_0();
  expand_back_front_1();
  expand_back_back_1();
  expand_front_front_1();
  expand_front_back_1();
  expand_back_n();
  expand_front_n();
  expand_alternating_n();
  return;
}

Assistant:

void run()
{
    expand_empty();
    expand_0();
    expand_back_front_1();
    expand_back_back_1();
    expand_front_front_1();
    expand_front_back_1();
    expand_back_n();
    expand_front_n();
    expand_alternating_n();
}